

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::Track(Track *this,uint *seed)

{
  uint64 uVar1;
  undefined8 *in_RDI;
  uint *unaff_retaddr;
  
  *in_RDI = &PTR__Track_00c926f8;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  uVar1 = MakeUID(unaff_retaddr);
  in_RDI[8] = uVar1;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  return;
}

Assistant:

Track::Track(unsigned int* seed)
    : codec_id_(NULL),
      codec_private_(NULL),
      language_(NULL),
      max_block_additional_id_(0),
      name_(NULL),
      number_(0),
      type_(0),
      uid_(MakeUID(seed)),
      codec_delay_(0),
      seek_pre_roll_(0),
      default_duration_(0),
      codec_private_length_(0),
      content_encoding_entries_(NULL),
      content_encoding_entries_size_(0) {}